

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  CLua *this;
  int iVar2;
  uint uVar3;
  
  puts("Hello World!");
  this = (CLua *)operator_new(0x20);
  CLua::CLua(this);
  pLua = this;
  CLua::AddFunction(this,"FAIL",FAIL);
  CLua::AddFunction(pLua,myFunctions);
  bVar1 = CLua::RunString(pLua,"print(\'Test String has run\')");
  iVar2 = 0;
  if (!bVar1) {
    puts("Failed to run c string");
    iVar2 = -1;
  }
  bVar1 = CLua::RunScript(pLua,"scripttest.lua");
  if (!bVar1) {
    puts("Failed to run script file");
    iVar2 = iVar2 + -2;
  }
  uVar3 = iVar2 + sLuaBasedTestResult;
  if (uVar3 == 0) {
    puts("All tests passed");
  }
  else {
    printf("Some test failed: Guru Medition:%d",(ulong)uVar3);
  }
  return uVar3;
}

Assistant:

int main()
{
    int retval = 0;
    printf("Hello World!\n");

    pLua = new CLua();
    pLua->AddFunction("FAIL", FAIL);
    pLua->AddFunction(myFunctions);

    if (!pLua->RunString("print('Test String has run')"))
    {
        printf("Failed to run c string\n");
        retval += -1;
    }
    if (!pLua->RunScript("scripttest.lua"))
    {
        printf("Failed to run script file\n");
        retval += -2;
    }

    retval += sLuaBasedTestResult;

    if (retval == 0)
    {
        printf("All tests passed\n");
    }
    else
    {
        printf("Some test failed: Guru Medition:%d", retval);
    }
    
    return retval;
}